

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O3

void modifyDeepChannels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
               *channels,half delta)

{
  uint uVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long lVar4;
  uint *puVar5;
  long lVar6;
  char cVar7;
  long lVar8;
  _List_node_base *p_Var9;
  float fVar10;
  uint uVar11;
  _List_node_base *p_Var12;
  ulong uVar13;
  ushort uVar14;
  float fVar15;
  _List_node_base *local_60;
  
  p_Var9 = (channels->
           super__List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)channels) {
    do {
      p_Var2 = p_Var9[1]._M_next;
      if (0 < (long)p_Var2) {
        p_Var3 = p_Var9[1]._M_prev;
        lVar4 = sampleCount->_sizeY;
        puVar5 = sampleCount->_data;
        local_60 = (_List_node_base *)0x0;
        do {
          lVar8 = _imath_half_to_float_table;
          if (0 < (long)p_Var3) {
            p_Var12 = (_List_node_base *)0x0;
            do {
              uVar1 = puVar5[(long)((long)&p_Var12->_M_next + lVar4 * (long)local_60)];
              if ((ulong)uVar1 != 0) {
                lVar6 = *(long *)(*(long *)(p_Var9 + 1 + 1) +
                                 (long)((long)&p_Var12->_M_next + (long)p_Var3 * (long)local_60) * 8
                                 );
                uVar13 = 0;
                do {
                  fVar15 = *(float *)(lVar8 + (ulong)*(ushort *)(lVar6 + uVar13 * 2) * 4) +
                           *(float *)(lVar8 + (ulong)delta._h * 4);
                  fVar10 = ABS(fVar15);
                  uVar14 = (ushort)((uint)fVar15 >> 0x10) & 0x8000;
                  if ((uint)fVar10 < 0x38800000) {
                    if ((0x33000000 < (uint)fVar10) &&
                       (uVar11 = (uint)fVar10 & 0x7fffff | 0x800000,
                       cVar7 = (char)((uint)fVar10 >> 0x17),
                       uVar14 = uVar14 | (ushort)(uVar11 >> (0x7eU - cVar7 & 0x1f)),
                       0x80000000 < uVar11 << (cVar7 + 0xa2U & 0x1f))) {
                      uVar14 = uVar14 + 1;
                    }
                  }
                  else if ((uint)fVar10 < 0x7f800000) {
                    if ((uint)fVar10 < 0x477ff000) {
                      uVar14 = (ushort)((int)fVar10 + 0x8000fff +
                                        (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd) | uVar14;
                    }
                    else {
                      uVar14 = uVar14 | 0x7c00;
                    }
                  }
                  else {
                    uVar14 = uVar14 | 0x7c00;
                    if (fVar10 != INFINITY) {
                      uVar11 = (uint)fVar10 >> 0xd & 0x3ff;
                      uVar14 = uVar14 | (ushort)uVar11 | (ushort)(uVar11 == 0);
                    }
                  }
                  *(ushort *)(lVar6 + uVar13 * 2) = uVar14;
                  uVar13 = uVar13 + 1;
                } while (uVar1 != uVar13);
              }
              p_Var12 = (_List_node_base *)((long)&p_Var12->_M_next + 1);
            } while (p_Var12 != p_Var3);
          }
          local_60 = (_List_node_base *)((long)&local_60->_M_next + 1);
        } while (local_60 != p_Var2);
      }
      p_Var9 = (((_List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                  *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var9 != (_List_node_base *)channels);
  }
  return;
}

Assistant:

void
modifyDeepChannels (
    Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels, T delta)
{
    //
    // Dummy code modifying each deep pixel by incrementing every sample of each channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                for (uint32_t j = 0; j < count; j++)
                    channel[y][x][j] += delta;
            }
        }
    }
}